

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaConLaw.cpp
# Opt level: O0

char * KindToStrIO(NaControlLawKind k)

{
  NaControlLawKind k_local;
  char *local_8;
  
  switch(k) {
  case clkConstant:
    local_8 = "constant";
    break;
  case clkMeander:
    local_8 = "meander";
    break;
  case clkSine:
    local_8 = "sine";
    break;
  case clkSineSine:
    local_8 = "sine_sine";
    break;
  case clkPike:
    local_8 = "pike";
    break;
  default:
    local_8 = "?kind?";
  }
  return local_8;
}

Assistant:

const char*     KindToStrIO (NaControlLawKind k)
{
    switch(k)
    {
    case clkConstant:
        return "constant";
    case clkMeander:
        return "meander";
    case clkSine:
        return "sine";
    case clkSineSine:
        return "sine_sine";
    case clkPike:
        return "pike";
    default:
        return "?kind?";
    }
}